

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O1

void __thiscall
CaDiCaL::LratChecker::delete_clause
          (LratChecker *this,uint64_t id,bool param_2,vector<int,_std::allocator<int>_> *c)

{
  int64_t *piVar1;
  pointer *ppiVar2;
  uint uVar3;
  Internal *pIVar4;
  LratCheckerClause *pLVar5;
  uint *puVar6;
  pointer piVar7;
  uint uVar8;
  int *lit;
  LratCheckerClause **ppLVar9;
  uint *puVar10;
  uint64_t uVar11;
  ulong uVar12;
  vector<int,_std::allocator<int>_> *__range2;
  double s;
  double s_00;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  pIVar4 = this->internal;
  if ((pIVar4->profiles).checking.level <= (pIVar4->opts).profile) {
    Internal::time(pIVar4,(time_t *)id);
    Internal::start_profiling(pIVar4,&(pIVar4->profiles).checking,s);
  }
  piVar1 = &(this->stats).deleted;
  *piVar1 = *piVar1 + 1;
  import_clause(this,c);
  this->last_id = id;
  ppLVar9 = find(this,id);
  pLVar5 = *ppLVar9;
  if (pLVar5 == (LratCheckerClause *)0x0) {
    delete_clause(this);
  }
  else {
    puVar6 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar10 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start; puVar10 != puVar6;
        puVar10 = puVar10 + 1) {
      uVar3 = *puVar10;
      uVar8 = -uVar3;
      if (0 < (int)uVar3) {
        uVar8 = uVar3;
      }
      id = (uint64_t)
           (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(undefined1 *)(id + (~(~uVar3 >> 0x1f) + uVar8 * 2)) = 1;
    }
    ppiVar2 = &(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (pLVar5->size != 0) {
      uVar12 = 0;
      do {
        uVar3 = pLVar5->literals[uVar12];
        uVar8 = -uVar3;
        if (0 < (int)uVar3) {
          uVar8 = uVar3;
        }
        if ((this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[~(~uVar3 >> 0x1f) + uVar8 * 2] == '\0') {
          id = (uint64_t)ppiVar2;
          delete_clause();
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < pLVar5->size);
    }
    puVar6 = (uint *)*ppiVar2;
    for (puVar10 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start; puVar10 != puVar6;
        puVar10 = puVar10 + 1) {
      uVar3 = *puVar10;
      uVar8 = -uVar3;
      if (0 < (int)uVar3) {
        uVar8 = uVar3;
      }
      id = (uint64_t)
           (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(undefined1 *)(id + (~(~uVar3 >> 0x1f) + uVar8 * 2)) = 0;
    }
    uVar11 = this->num_garbage + 1;
    this->num_garbage = uVar11;
    this->num_clauses = this->num_clauses - 1;
    *ppLVar9 = pLVar5->next;
    pLVar5->next = this->garbage;
    this->garbage = pLVar5;
    pLVar5->garbage = true;
    auVar13._8_4_ = (int)(uVar11 >> 0x20);
    auVar13._0_8_ = uVar11;
    auVar13._12_4_ = 0x45300000;
    uVar12 = this->size_vars;
    if ((ulong)this->size_vars < this->size_clauses) {
      uVar12 = this->size_clauses;
    }
    auVar14._8_4_ = (int)(uVar12 >> 0x20);
    auVar14._0_8_ = uVar12;
    auVar14._12_4_ = 0x45300000;
    if (((auVar14._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0)) * 0.5 <
        (auVar13._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)) {
      collect_garbage_clauses(this);
    }
  }
  piVar7 = (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar7) {
    (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar7;
  }
  pIVar4 = this->internal;
  if ((pIVar4->profiles).checking.level <= (pIVar4->opts).profile) {
    Internal::time(pIVar4,(time_t *)id);
    Internal::stop_profiling(pIVar4,&(pIVar4->profiles).checking,s_00);
    return;
  }
  return;
}

Assistant:

void LratChecker::delete_clause (uint64_t id, bool, const vector<int> &c) {
  START (checking);
  LOG (c, "LRAT CHECKER checking deletion of clause[%" PRIu64 "]", id);
  stats.deleted++;
  import_clause (c);
  last_id = id;
  LratCheckerClause **p = find (id), *d = *p;
  if (d) {
    for (const auto &lit : imported_clause)
      mark (lit) = true;
    const int *dp = d->literals;
    for (unsigned i = 0; i < d->size; i++) {
      int lit = *(dp + i);
      if (!mark (lit)) {        // should never happen since ids
        fatal_message_start (); // are unique.
        fputs ("deleted clause not in proof:\n", stderr);
        for (const auto &lit : imported_clause)
          fprintf (stderr, "%d ", lit);
        fputc ('0', stderr);
        fatal_message_end ();
      }
    }
    for (const auto &lit : imported_clause)
      mark (lit) = false;

    // Remove from hash table, mark as garbage, connect to garbage list.
    num_garbage++;
    assert (num_clauses);
    num_clauses--;
    *p = d->next;
    d->next = garbage;
    garbage = d;
    d->garbage = true;

    // If there are enough garbage clauses collect them.
    // TODO: probably can just delete clause directly without
    // specific garbage collection phase.
    if (num_garbage > 0.5 * max ((size_t) size_clauses, (size_t) size_vars))
      collect_garbage_clauses ();
  } else {
    fatal_message_start ();
    fputs ("deleted clause not in proof:\n", stderr);
    for (const auto &lit : imported_clause)
      fprintf (stderr, "%d ", lit);
    fputc ('0', stderr);
    fatal_message_end ();
  }
  imported_clause.clear ();
  STOP (checking);
}